

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popups.cpp
# Opt level: O0

bool CEditor::PopupSelectImage(void *pContext,CUIRect View)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  IInput *pIVar7;
  CEditorImage **ppCVar8;
  IGraphics *pIVar9;
  CEditor *in_RDI;
  long in_FS_OFFSET;
  float fVar10;
  float fVar11;
  float Max;
  int i;
  bool ClosePopup;
  int ShowImage;
  CEditor *pEditor;
  CQuadItem QuadItem;
  CUIRect Button;
  CUIRect ImageView;
  CUIRect ButtonBar;
  CUIRect *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  float in_stack_ffffffffffffff44;
  CUIRect *in_stack_ffffffffffffff48;
  int *piVar12;
  CUIRect *pRect;
  CEditor *pCVar13;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  int iVar14;
  uint in_stack_ffffffffffffff88;
  CQuadItem local_5c;
  uint local_4c;
  char *in_stack_ffffffffffffffc0;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CUIRect::VSplitLeft(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,in_stack_ffffffffffffff38,
                      (CUIRect *)0x21562d);
  CUIRect::Margin(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,in_stack_ffffffffffffff38);
  in_stack_ffffffffffffff88 = in_stack_ffffffffffffff88 & 0xffffff;
  iVar14 = -1;
  iVar6 = g_SelectImageCurrent;
  while (iVar5 = iVar14,
        iVar3 = array<CEditorImage_*,_allocator_default<CEditorImage_*>_>::size
                          (&(in_RDI->m_Map).m_lImages), iVar14 < iVar3) {
    CUIRect::HSplitTop(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,in_stack_ffffffffffffff38
                       ,(CUIRect *)0x2156ac);
    CUIRect::HSplitTop(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,in_stack_ffffffffffffff38
                       ,(CUIRect *)0x2156c8);
    UI(in_RDI);
    bVar2 = CUI::MouseInside((CUI *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                             in_stack_ffffffffffffff38);
    iVar3 = iVar5;
    if (!bVar2) {
      iVar3 = iVar6;
    }
    iVar6 = iVar3;
    pCVar13 = in_RDI;
    if (iVar5 == -1) {
      piVar12 = &PopupSelectImage::s_NoImageButton;
    }
    else {
      piVar12 = (int *)array<CEditorImage_*,_allocator_default<CEditorImage_*>_>::operator[]
                                 (&(in_RDI->m_Map).m_lImages,iVar5);
    }
    iVar3 = (int)((ulong)pCVar13 >> 0x20);
    pRect = (CUIRect *)piVar12;
    if (iVar5 != -1) {
      array<CEditorImage_*,_allocator_default<CEditorImage_*>_>::operator[]
                (&(in_RDI->m_Map).m_lImages,iVar5);
    }
    in_stack_ffffffffffffff38 = (CUIRect *)0x0;
    iVar14 = DoButton_MenuItem((CEditor *)CONCAT44(iVar6,in_stack_ffffffffffffff88),
                               (void *)CONCAT44(iVar5,in_stack_ffffffffffffff80),
                               (char *)CONCAT44(iVar14,in_stack_ffffffffffffff78),iVar3,pRect,
                               (int)((ulong)piVar12 >> 0x20),in_stack_ffffffffffffffc0);
    if (iVar14 != 0) {
      g_SelectImageSelected = iVar5;
      pIVar7 = Input(in_RDI);
      uVar4 = (*(pIVar7->super_IInterface)._vptr_IInterface[0xb])();
      in_stack_ffffffffffffff88 =
           CONCAT13((in_stack_ffffffffffffff88 & 0x1000000) != 0 || (uVar4 & 1) != 0,
                    (int3)in_stack_ffffffffffffff88);
    }
    iVar14 = iVar5 + 1;
  }
  if ((-1 < iVar6) &&
     (iVar14 = iVar6,
     iVar5 = array<CEditorImage_*,_allocator_default<CEditorImage_*>_>::size
                       (&(in_RDI->m_Map).m_lImages), iVar6 < iVar5)) {
    if (local_30 <= local_2c) {
      local_2c = local_30;
    }
    ppCVar8 = array<CEditorImage_*,_allocator_default<CEditorImage_*>_>::operator[]
                        (&(in_RDI->m_Map).m_lImages,iVar14);
    iVar6 = ((*ppCVar8)->super_CImageInfo).m_Width;
    ppCVar8 = array<CEditorImage_*,_allocator_default<CEditorImage_*>_>::operator[]
                        (&(in_RDI->m_Map).m_lImages,iVar14);
    iVar6 = maximum<int>(iVar6,((*ppCVar8)->super_CImageInfo).m_Height);
    fVar10 = (float)iVar6;
    ppCVar8 = array<CEditorImage_*,_allocator_default<CEditorImage_*>_>::operator[]
                        (&(in_RDI->m_Map).m_lImages,iVar14);
    fVar11 = (float)((*ppCVar8)->super_CImageInfo).m_Width / fVar10;
    ppCVar8 = array<CEditorImage_*,_allocator_default<CEditorImage_*>_>::operator[]
                        (&(in_RDI->m_Map).m_lImages,iVar14);
    iVar6 = ((*ppCVar8)->super_CImageInfo).m_Height;
    pIVar9 = Graphics(in_RDI);
    ppCVar8 = array<CEditorImage_*,_allocator_default<CEditorImage_*>_>::operator[]
                        (&(in_RDI->m_Map).m_lImages,iVar14);
    local_4c = ((*ppCVar8)->m_Texture).m_Id;
    (*(pIVar9->super_IInterface)._vptr_IInterface[0x13])(pIVar9,(ulong)local_4c);
    pIVar9 = Graphics(in_RDI);
    (*(pIVar9->super_IInterface)._vptr_IInterface[8])();
    pIVar9 = Graphics(in_RDI);
    (*(pIVar9->super_IInterface)._vptr_IInterface[0xb])();
    pIVar9 = Graphics(in_RDI);
    (*(pIVar9->super_IInterface)._vptr_IInterface[0x17])();
    IGraphics::CQuadItem::CQuadItem
              (&local_5c,local_38,local_34,fVar11 * local_2c,((float)iVar6 / fVar10) * local_2c);
    pIVar9 = Graphics(in_RDI);
    (*(pIVar9->super_IInterface)._vptr_IInterface[0x1d])(pIVar9,&local_5c,1);
    pIVar9 = Graphics(in_RDI);
    (*(pIVar9->super_IInterface)._vptr_IInterface[0x18])();
    pIVar9 = Graphics(in_RDI);
    (*(pIVar9->super_IInterface)._vptr_IInterface[10])();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)((byte)(in_stack_ffffffffffffff88 >> 0x18) & 1);
}

Assistant:

bool CEditor::PopupSelectImage(void *pContext, CUIRect View)
{
	CEditor *pEditor = (CEditor *)pContext;
	CUIRect ButtonBar, ImageView;
	View.VSplitLeft(80.0f, &ButtonBar, &View);
	View.Margin(10.0f, &ImageView);

	int ShowImage = g_SelectImageCurrent;
	bool ClosePopup = false;

	static int s_NoImageButton;
	for(int i = -1; i < pEditor->m_Map.m_lImages.size(); i++)
	{
		CUIRect Button;
		ButtonBar.HSplitTop(12.0f, &Button, &ButtonBar);
		ButtonBar.HSplitTop(2.0f, 0, &ButtonBar);

		if(pEditor->UI()->MouseInside(&Button))
			ShowImage = i;

		if(pEditor->DoButton_MenuItem(i == -1 ? (void *)&s_NoImageButton : &pEditor->m_Map.m_lImages[i], i == -1 ? "None" : pEditor->m_Map.m_lImages[i]->m_aName, i == g_SelectImageCurrent, &Button))
		{
			g_SelectImageSelected = i;
			ClosePopup |= pEditor->Input()->MouseDoubleClick();
		}
	}

	if(ShowImage >= 0 && ShowImage < pEditor->m_Map.m_lImages.size())
	{
		if(ImageView.h < ImageView.w)
			ImageView.w = ImageView.h;
		else
			ImageView.h = ImageView.w;
		float Max = (float)(maximum(pEditor->m_Map.m_lImages[ShowImage]->m_Width, pEditor->m_Map.m_lImages[ShowImage]->m_Height));
		ImageView.w *= pEditor->m_Map.m_lImages[ShowImage]->m_Width/Max;
		ImageView.h *= pEditor->m_Map.m_lImages[ShowImage]->m_Height/Max;
		pEditor->Graphics()->TextureSet(pEditor->m_Map.m_lImages[ShowImage]->m_Texture);
		pEditor->Graphics()->BlendNormal();
		pEditor->Graphics()->WrapClamp();
		pEditor->Graphics()->QuadsBegin();
		IGraphics::CQuadItem QuadItem(ImageView.x, ImageView.y, ImageView.w, ImageView.h);
		pEditor->Graphics()->QuadsDrawTL(&QuadItem, 1);
		pEditor->Graphics()->QuadsEnd();
		pEditor->Graphics()->WrapNormal();
	}

	return ClosePopup;
}